

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_aggregate_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::BaseSelectBinder::BindAggregate
          (BindResult *__return_storage_ptr__,BaseSelectBinder *this,FunctionExpression *aggr,
          AggregateFunctionCatalogEntry *func,idx_t depth)

{
  string *__lhs;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_00
  ;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr;
  unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true> *this_01;
  char cVar1;
  undefined1 uVar2;
  ClientContext *pCVar3;
  pointer pVVar4;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var5;
  pointer pOVar6;
  Binder *pBVar7;
  pointer pBVar8;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> _Var9;
  BoundSelectNode *pBVar10;
  pointer puVar11;
  pointer puVar12;
  optional_ptr<duckdb::Binder,_true> oVar13;
  pointer pLVar14;
  key_type kVar15;
  bool bVar16;
  bool bVar17;
  OrderType order_type;
  OrderByNullType OVar18;
  int iVar19;
  pointer pOVar20;
  reference pvVar21;
  reference pvVar22;
  type pPVar23;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar24;
  pointer pEVar25;
  type pEVar26;
  vector<duckdb::Value,_true> *pvVar27;
  pointer pPVar28;
  BaseExpression *this_02;
  ConstantExpression *pCVar29;
  ClientConfig *pCVar30;
  idx_t offset;
  DBConfig *pDVar31;
  pointer pBVar32;
  pointer pBVar33;
  iterator iVar34;
  mapped_type *pmVar35;
  reference pvVar36;
  BinderException *pBVar37;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_03;
  AggregateFunctionSet *this_04;
  idx_t i;
  pointer pBVar38;
  size_type __n;
  byte bVar39;
  key_type kVar40;
  ulong uVar41;
  pointer pOVar42;
  pointer v;
  FunctionBinder local_6b8;
  vector<duckdb::LogicalType,_true> types;
  ulong local_688;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_680;
  OrderType sense;
  undefined7 uStack_677;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_608;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_600;
  _Head_base<0UL,_duckdb::BoundAggregateExpression_*,_false> local_5f8;
  Binder *local_5f0;
  vector<duckdb::LogicalType,_true> arguments;
  idx_t depth_local;
  AggregateFunctionCatalogEntry *local_5c8;
  OrderByNullType null_order;
  undefined7 uStack_5bf;
  size_type local_5b8;
  optional_idx best_function;
  FunctionBinder function_binder;
  AggregateFunction bound_function;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_468;
  AggregateBinder aggregate_binder;
  ErrorData error;
  ErrorData local_360;
  ErrorData local_2e0;
  ErrorData local_260;
  AggregateFunction local_1e0;
  ErrorData local_b0;
  
  this->bound_aggregate = true;
  depth_local = depth;
  local_5c8 = func;
  AggregateBinder::AggregateBinder
            (&aggregate_binder,(this->super_ExpressionBinder).binder,
             (this->super_ExpressionBinder).context);
  ErrorData::ErrorData(&error);
  expr = &aggr->filter;
  if ((aggr->filter).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    ExpressionBinder::BindChild(&aggregate_binder.super_ExpressionBinder,expr,0,&error);
  }
  this_01 = &aggr->order_bys;
  bVar17 = true;
  if ((aggr->order_bys).
      super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
      super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
      super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl == (OrderModifier *)0x0) {
LAB_01282b0e:
    bVar16 = false;
    local_688 = 0;
  }
  else {
    pOVar20 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
              operator->(this_01);
    if ((long)(pOVar20->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pOVar20->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start != 0x10) goto LAB_01282b0e;
    __lhs = &aggr->function_name;
    bVar16 = ::std::operator==(__lhs,"mode");
    if (bVar16) {
      local_688 = 1;
      bVar16 = false;
    }
    else {
      bVar16 = ::std::operator==(__lhs,"quantile_cont");
      if (!bVar16) {
        bVar16 = ::std::operator==(__lhs,"quantile_disc");
        if (!bVar16) goto LAB_01282b0e;
      }
      pDVar31 = DBConfig::GetConfig((this->super_ExpressionBinder).context);
      pOVar20 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->(this_01);
      pvVar21 = vector<duckdb::OrderByNode,_true>::get<true>(&pOVar20->orders,0);
      cVar1 = pvVar21->type;
      if (cVar1 == '\x01') {
        uVar2 = (pDVar31->options).default_order_type;
        cVar1 = uVar2;
      }
      bVar16 = cVar1 == '\x03';
      local_688 = 2;
    }
    bVar17 = false;
  }
  this_03 = &aggr->children;
  for (uVar41 = 0;
      uVar41 < (ulong)((long)(aggr->children).
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(aggr->children).
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar41 = uVar41 + 1) {
    pvVar22 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(this_03,uVar41);
    ExpressionBinder::BindChild(&aggregate_binder.super_ExpressionBinder,pvVar22,0,&error);
    if ((error.initialized == false && !bVar17) &&
       (uVar41 == ((long)(aggr->children).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(aggr->children).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U)) {
      pCVar3 = (this->super_ExpressionBinder).context;
      pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(pvVar22);
      puVar24 = BoundExpression::GetExpression(pPVar23);
      pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar24);
      iVar19 = (*(pEVar25->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar25);
      if ((char)iVar19 != '\0') {
        pEVar26 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(puVar24);
        ExpressionExecutor::EvaluateScalar((Value *)&bound_function,pCVar3,pEVar26,false);
        if ((char)bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                  _vptr_Function == 'e') {
          types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pvVar27 = ListValue::GetChildren((Value *)&bound_function);
          pVVar4 = (pvVar27->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (v = (pvVar27->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_start; v != pVVar4; v = v + 1) {
            NegatePercentileValue((Value *)&sense,v,bVar16);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&types,
                       (Value *)&sense);
            Value::~Value((Value *)&sense);
          }
          if (types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start ==
              types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&sense,"Empty list in percentile not allowed",
                       (allocator *)&arguments);
            BinderException::BinderException(pBVar37,(string *)&sense);
            __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&arguments,
                     (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&types);
          Value::LIST((Value *)&sense,(vector<duckdb::Value,_true> *)&arguments);
          make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                    ((duckdb *)&children,(Value *)&sense);
          puVar11 = children.
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          _Var5._M_head_impl =
               (puVar24->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (puVar24->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)puVar11;
          if (_Var5._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
            if (children.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              (**(code **)&((((children.
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                             )._M_t.
                             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                             .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                           super_BaseExpression).type)();
            }
          }
          children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          Value::~Value((Value *)&sense);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&arguments);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&types);
        }
        else {
          NegatePercentileValue((Value *)&sense,(Value *)&bound_function,bVar16);
          make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&types,(Value *)&sense)
          ;
          pLVar14 = types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          _Var5._M_head_impl =
               (puVar24->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (puVar24->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)pLVar14;
          if (_Var5._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
            if (types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              (**(code **)(*(long *)types.
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          Value::~Value((Value *)&sense);
        }
        Value::~Value((Value *)&bound_function);
      }
    }
  }
  if ((this_01->super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
      super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl != (OrderModifier *)0x0) {
    pOVar20 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
              operator->(this_01);
    if ((pOVar20->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
        super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pOVar20->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
        super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pOVar20 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->(this_01);
      pOVar6 = (pOVar20->orders).
               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
               .super__Vector_impl_data._M_finish;
      for (pOVar42 = (pOVar20->orders).
                     super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                     super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                     _M_impl.super__Vector_impl_data._M_start; pOVar42 != pOVar6;
          pOVar42 = pOVar42 + 1) {
        this_00 = &pOVar42->expression;
        pPVar28 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(this_00);
        if ((pPVar28->super_BaseExpression).type == VALUE_CONSTANT) {
          this_02 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->(this_00)->super_BaseExpression;
          pCVar29 = BaseExpression::Cast<duckdb::ConstantExpression>(this_02);
          bVar16 = LogicalType::IsIntegral(&(pCVar29->value).type_);
          if (!bVar16) {
            pCVar30 = ClientConfig::GetConfig((this->super_ExpressionBinder).context);
            if (pCVar30->order_by_non_integer_literal == false) {
              pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
              pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator*(this_00);
              ::std::__cxx11::string::string
                        ((string *)&bound_function,
                         "ORDER BY non-integer literal has no effect.\n* SET order_by_non_integer_literal=true to allow this behavior.\n\nPerhaps you misplaced ORDER BY; ORDER BY must appear after all regular arguments of the aggregate."
                         ,(allocator *)&sense);
              BinderException::BinderException<>(pBVar37,pPVar23,(string *)&bound_function);
              __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
        }
        ExpressionBinder::BindChild(&aggregate_binder.super_ExpressionBinder,this_00,0,&error);
      }
    }
  }
  if (error.initialized == true) {
    if (aggregate_binder.super_ExpressionBinder.bound_columns.
        super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        .
        super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        aggregate_binder.super_ExpressionBinder.bound_columns.
        super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        .
        super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ErrorData::ErrorData(&local_b0,&error);
      BindResult::BindResult(__return_storage_ptr__,&local_b0);
      ErrorData::~ErrorData(&local_b0);
      goto LAB_012838fb;
    }
    for (uVar41 = 0;
        uVar41 < (ulong)((long)(aggr->children).
                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(aggr->children).
                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar41 = uVar41 + 1)
    {
      pvVar22 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::get<true>(this_03,uVar41);
      ErrorData::ErrorData(&local_260,&error);
      ExpressionBinder::BindCorrelatedColumns
                ((BindResult *)&bound_function,&aggregate_binder.super_ExpressionBinder,pvVar22,
                 &local_260);
      ErrorData::~ErrorData(&local_260);
      if ((char)bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
                _M_dataplus._M_p == '\x01') {
        ::std::__cxx11::string::string
                  ((string *)&sense,anon_var_dwarf_3b2a81b + 9,(allocator *)&types);
        ErrorData::Throw((ErrorData *)
                         &bound_function.super_BaseScalarFunction.super_SimpleFunction.
                          super_Function.name,(string *)&sense);
      }
      pvVar22 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::get<true>(this_03,uVar41);
      pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(pvVar22);
      puVar24 = BoundExpression::GetExpression(pPVar23);
      pBVar7 = (this->super_ExpressionBinder).binder;
      pEVar26 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(puVar24);
      ExpressionBinder::ExtractCorrelatedExpressions(pBVar7,pEVar26);
      BindResult::~BindResult((BindResult *)&bound_function);
    }
    if ((expr->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      ErrorData::ErrorData(&local_360,&error);
      ExpressionBinder::BindCorrelatedColumns
                ((BindResult *)&bound_function,&aggregate_binder.super_ExpressionBinder,expr,
                 &local_360);
      ErrorData::~ErrorData(&local_360);
      if ((char)bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
                _M_dataplus._M_p == '\x01') {
        ::std::__cxx11::string::string
                  ((string *)&sense,anon_var_dwarf_3b2a81b + 9,(allocator *)&types);
        ErrorData::Throw((ErrorData *)
                         &bound_function.super_BaseScalarFunction.super_SimpleFunction.
                          super_Function.name,(string *)&sense);
      }
      pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(expr);
      puVar24 = BoundExpression::GetExpression(pPVar23);
      pBVar7 = (this->super_ExpressionBinder).binder;
      pEVar26 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(puVar24);
      ExpressionBinder::ExtractCorrelatedExpressions(pBVar7,pEVar26);
      BindResult::~BindResult((BindResult *)&bound_function);
    }
    if ((this_01->
        super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>)._M_t.
        super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
        .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl != (OrderModifier *)0x0)
    {
      pOVar20 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->(this_01);
      if ((pOVar20->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
          super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pOVar20->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
          super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pOVar20 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                  ::operator->(this_01);
        pOVar6 = (pOVar20->orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pOVar42 = (pOVar20->orders).
                       super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                       ._M_impl.super__Vector_impl_data._M_start; pOVar42 != pOVar6;
            pOVar42 = pOVar42 + 1) {
          ErrorData::ErrorData(&local_2e0,&error);
          ExpressionBinder::BindCorrelatedColumns
                    ((BindResult *)&bound_function,&aggregate_binder.super_ExpressionBinder,
                     &pOVar42->expression,&local_2e0);
          ErrorData::~ErrorData(&local_2e0);
          if ((char)bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name
                    ._M_dataplus._M_p == '\x01') {
            ::std::__cxx11::string::string
                      ((string *)&sense,anon_var_dwarf_3b2a81b + 9,(allocator *)&types);
            ErrorData::Throw((ErrorData *)
                             &bound_function.super_BaseScalarFunction.super_SimpleFunction.
                              super_Function.name,(string *)&sense);
          }
          pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(&pOVar42->expression);
          puVar24 = BoundExpression::GetExpression(pPVar23);
          pBVar7 = (this->super_ExpressionBinder).binder;
          pEVar26 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(puVar24);
          ExpressionBinder::ExtractCorrelatedExpressions(pBVar7,pEVar26);
          BindResult::~BindResult((BindResult *)&bound_function);
        }
      }
    }
  }
  else if ((depth_local != 0) &&
          (aggregate_binder.super_ExpressionBinder.bound_columns.
           super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
           .
           super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           aggregate_binder.super_ExpressionBinder.bound_columns.
           super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
           .
           super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
    ::std::__cxx11::string::string
              ((string *)&bound_function,
               "Aggregate with only constant parameters has to be bound in the root subquery",
               (allocator *)&sense);
    BindResult::BindResult(__return_storage_ptr__,(string *)&bound_function);
    ::std::__cxx11::string::~string((string *)&bound_function);
    goto LAB_012838fb;
  }
  if ((expr->
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
      (ParsedExpression *)0x0) {
    kVar40._M_data = (Expression *)0x0;
  }
  else {
    pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(expr);
    puVar24 = BoundExpression::GetExpression(pPVar23);
    pCVar3 = (this->super_ExpressionBinder).context;
    local_680._M_head_impl =
         (puVar24->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (puVar24->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    LogicalType::LogicalType((LogicalType *)&bound_function,BOOLEAN);
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)&sense,pCVar3,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_680,(LogicalType *)&bound_function,false);
    kVar40._M_data = _sense;
    _sense = (Expression *)0x0;
    LogicalType::~LogicalType((LogicalType *)&bound_function);
    if (local_680._M_head_impl != (Expression *)0x0) {
      (*((local_680._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_680._M_head_impl = (Expression *)0x0;
  }
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  children.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  children.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  children.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (!bVar17) {
    bVar17 = ::std::operator==(&aggr->function_name,"mode");
    if ((ulong)((long)(aggr->children).
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(aggr->children).
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) < local_688) {
      pOVar20 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->(this_01);
      pOVar6 = (pOVar20->orders).
               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
               .super__Vector_impl_data._M_finish;
      for (pOVar42 = (pOVar20->orders).
                     super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                     super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                     _M_impl.super__Vector_impl_data._M_start; pOVar42 != pOVar6;
          pOVar42 = pOVar42 + 1) {
        pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(&pOVar42->expression);
        puVar24 = BoundExpression::GetExpression(pPVar23);
        pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(puVar24);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   &pEVar25->return_type);
        pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(puVar24);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&arguments.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   &pEVar25->return_type);
        if (bVar17) {
          pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(puVar24);
          (*(pEVar25->super_BaseExpression)._vptr_BaseExpression[0x11])(&bound_function,pEVar25);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&children,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&bound_function);
          if ((long *)CONCAT71(bound_function.super_BaseScalarFunction.super_SimpleFunction.
                               super_Function._vptr_Function._1_7_,
                               (char)bound_function.super_BaseScalarFunction.super_SimpleFunction.
                                     super_Function._vptr_Function) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(bound_function.super_BaseScalarFunction.
                                           super_SimpleFunction.super_Function._vptr_Function._1_7_,
                                           (char)bound_function.super_BaseScalarFunction.
                                                 super_SimpleFunction.super_Function._vptr_Function)
                        + 8))();
          }
        }
        else {
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&children,puVar24);
        }
      }
    }
    if (!bVar17) {
      pOVar20 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->(this_01);
      ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::clear
                (&(pOVar20->orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>);
    }
  }
  for (uVar41 = 0;
      uVar41 < (ulong)((long)(aggr->children).
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(aggr->children).
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar41 = uVar41 + 1) {
    pvVar22 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(this_03,uVar41);
    pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(pvVar22);
    puVar24 = BoundExpression::GetExpression(pPVar23);
    pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar24);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &pEVar25->return_type);
    pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar24);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &pEVar25->return_type);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&children,puVar24);
  }
  FunctionBinder::FunctionBinder(&function_binder,(this->super_ExpressionBinder).binder);
  this_04 = &local_5c8->functions;
  best_function =
       FunctionBinder::BindFunction
                 (&function_binder,
                  &(local_5c8->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                   super_CatalogEntry.name,this_04,&types,&error);
  if (best_function.index == 0xffffffffffffffff) {
    ErrorData::AddQueryLocation(&error,&aggr->super_ParsedExpression);
    ::std::__cxx11::string::string
              ((string *)&bound_function,anon_var_dwarf_3b2a81b + 9,(allocator *)&sense);
    ErrorData::Throw(&error,(string *)&bound_function);
  }
  offset = optional_idx::GetIndex(&best_function);
  FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
            (&bound_function,&this_04->super_FunctionSet<duckdb::AggregateFunction>,offset);
  local_6b8.context = (ClientContext *)0x0;
  pOVar20 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
            operator->(this_01);
  if ((pOVar20->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pOVar20->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    make_uniq<duckdb::BoundOrderModifier>();
    kVar15._M_data = _sense;
    pCVar3 = local_6b8.context;
    _sense = (Expression *)0x0;
    local_6b8.context = (ClientContext *)kVar15._M_data;
    if ((Binder *)pCVar3 != (Binder *)0x0) {
      (*(((Expression *)&pCVar3->super_enable_shared_from_this<duckdb::ClientContext>)->
        super_BaseExpression)._vptr_BaseExpression[1])();
      if ((Binder *)_sense != (Binder *)0x0) {
        (*(((Expression *)&_sense->super_BaseExpression)->super_BaseExpression)._vptr_BaseExpression
          [1])();
      }
    }
    pDVar31 = DBConfig::GetConfig((this->super_ExpressionBinder).context);
    pOVar20 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
              operator->(this_01);
    pOVar6 = (pOVar20->orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pOVar42 = (pOVar20->orders).
                   super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   _M_impl.super__Vector_impl_data._M_start; pOVar42 != pOVar6;
        pOVar42 = pOVar42 + 1) {
      pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(&pOVar42->expression);
      puVar24 = BoundExpression::GetExpression(pPVar23);
      pCVar3 = (this->super_ExpressionBinder).context;
      pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar24);
      ExpressionBinder::PushCollation(pCVar3,puVar24,&pEVar25->return_type,ALL_COLLATIONS);
      order_type = DBConfig::ResolveOrder(pDVar31,pOVar42->type);
      sense = order_type;
      OVar18 = DBConfig::ResolveNullOrder(pDVar31,order_type,pOVar42->null_order);
      _null_order = CONCAT71(uStack_5bf,OVar18);
      pBVar32 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                              *)&local_6b8.context);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar32->orders,&sense,&null_order,puVar24);
    }
  }
  if ((aggr->distinct == true) && ((Binder *)local_6b8.context != (Binder *)0x0)) {
    pBVar32 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
              ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                            *)&local_6b8.context);
    pBVar8 = (pBVar32->orders).
             super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
             super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar39 = 1;
    for (pBVar38 = (pBVar32->orders).
                   super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                   .
                   super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                   ._M_impl.super__Vector_impl_data._M_start; pBVar38 != pBVar8;
        pBVar38 = pBVar38 + 1) {
      bVar17 = IsFunctionallyDependent(&pBVar38->expression,&children);
      bVar39 = bVar39 & bVar17;
    }
    if (bVar39 == 0) {
      pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&sense,
                 "In a DISTINCT aggregate, ORDER BY expressions must appear in the argument list",
                 (allocator *)&null_order);
      BinderException::BinderException(pBVar37,(string *)&sense);
      __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  AggregateFunction::AggregateFunction(&local_1e0,&bound_function);
  local_468.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       children.
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_468.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       children.
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_468.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       children.
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  children.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  children.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  children.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f0 = (Binder *)kVar40._M_data;
  FunctionBinder::BindAggregateFunction
            (&local_6b8,(AggregateFunction *)&function_binder,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_1e0,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_468,(AggregateType)&local_5f0);
  if (local_5f0 != (Binder *)0x0) {
    (*(((Expression *)&local_5f0->super_enable_shared_from_this<duckdb::Binder>)->
      super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_5f0 = (Binder *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_468);
  AggregateFunction::~AggregateFunction(&local_1e0);
  if (aggr->export_state == true) {
    local_5f8._M_head_impl = (BoundAggregateExpression *)local_6b8.binder.ptr;
    local_6b8.binder.ptr = (Binder *)0x0;
    ExportAggregateFunction::Bind
              ((ExportAggregateFunction *)&sense,
               (unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                *)&local_5f8);
    kVar40._M_data = _sense;
    oVar13.ptr = local_6b8.binder.ptr;
    _sense = (Expression *)0x0;
    local_6b8.binder.ptr = (Binder *)kVar40._M_data;
    if (oVar13.ptr != (Binder *)0x0) {
      (*(code *)((((oVar13.ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                  internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      if (_sense != (Expression *)0x0) {
        (*(_sense->super_BaseExpression)._vptr_BaseExpression[1])();
      }
    }
    _sense = (Expression *)0x0;
    if ((Binder *)local_5f8._M_head_impl != (Binder *)0x0) {
      (*((local_5f8._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
    }
    local_5f8._M_head_impl = (BoundAggregateExpression *)0x0;
  }
  pBVar33 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                          *)&local_6b8);
  pCVar3 = local_6b8.context;
  local_6b8.context = (ClientContext *)0x0;
  _Var9._M_head_impl =
       (pBVar33->order_bys).
       super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
       .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl;
  (pBVar33->order_bys).
  super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
  .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl =
       (BoundOrderModifier *)pCVar3;
  if (_Var9._M_head_impl != (BoundOrderModifier *)0x0) {
    (**(code **)(*(long *)&(_Var9._M_head_impl)->super_BoundResultModifier + 8))();
  }
  pBVar10 = this->node;
  _sense = &unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
            ::operator*((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                         *)&local_6b8)->super_Expression;
  iVar34 = ::std::
           _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(pBVar10->aggregate_map)._M_h,(key_type *)&sense);
  if (iVar34.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    pBVar10 = this->node;
    puVar11 = (pBVar10->aggregates).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    puVar12 = (pBVar10->aggregates).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    _sense = &unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator*((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                           *)&local_6b8)->super_Expression;
    pmVar35 = ::std::__detail::
              _Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pBVar10->aggregate_map,(key_type *)&sense);
    _sense = (Expression *)local_6b8.binder.ptr;
    __n = (long)puVar11 - (long)puVar12 >> 3;
    *pmVar35 = __n;
    local_6b8.binder.ptr = (Binder *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&this->node->aggregates,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &sense);
    if ((Binder *)_sense != (Binder *)0x0) {
      (*(((Expression *)&_sense->super_BaseExpression)->super_BaseExpression)._vptr_BaseExpression
        [1])();
    }
  }
  else {
    __n = *(size_type *)
           ((long)iVar34.
                  super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_true>
                  ._M_cur + 0x10);
  }
  if ((aggr->super_ParsedExpression).super_BaseExpression.alias._M_string_length == 0) {
    pvVar36 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(&this->node->aggregates,__n);
    pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(pvVar36);
    (*(pEVar25->super_BaseExpression)._vptr_BaseExpression[8])(&sense,pEVar25);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)&sense,(string *)&(aggr->super_ParsedExpression).super_BaseExpression.alias
              );
  }
  pvVar36 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(&this->node->aggregates,__n);
  pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar36);
  _null_order = this->node->aggregate_index;
  local_5b8 = __n;
  make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string_const,duckdb::LogicalType&,duckdb::ColumnBinding,unsigned_long&>
            ((duckdb *)&local_600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sense,
             &pEVar25->return_type,(ColumnBinding *)&null_order,&depth_local);
  ::std::__cxx11::string::~string((string *)&sense);
  local_608._M_head_impl = (Expression *)local_600._M_head_impl;
  local_600._M_head_impl = (BoundCastData *)0x0;
  BindResult::BindResult
            (__return_storage_ptr__,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_608);
  if (local_608._M_head_impl != (Expression *)0x0) {
    (*((local_608._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_608._M_head_impl = (Expression *)0x0;
  if (local_600._M_head_impl != (BoundCastData *)0x0) {
    (*(local_600._M_head_impl)->_vptr_BoundCastData[1])();
  }
  if (local_6b8.binder.ptr != (Binder *)0x0) {
    (*(((Expression *)&(local_6b8.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>)->
      super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_6b8.context != (ClientContext *)0x0) {
    (*(code *)((((local_6b8.context)->super_enable_shared_from_this<duckdb::ClientContext>).
                __weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  AggregateFunction::~AggregateFunction(&bound_function);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&children.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           );
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
LAB_012838fb:
  ErrorData::~ErrorData(&error);
  ExpressionBinder::~ExpressionBinder(&aggregate_binder.super_ExpressionBinder);
  return __return_storage_ptr__;
}

Assistant:

BindResult BaseSelectBinder::BindAggregate(FunctionExpression &aggr, AggregateFunctionCatalogEntry &func, idx_t depth) {
	// first bind the child of the aggregate expression (if any)
	this->bound_aggregate = true;
	unique_ptr<Expression> bound_filter;
	AggregateBinder aggregate_binder(binder, context);
	ErrorData error;

	// Now we bind the filter (if any)
	if (aggr.filter) {
		aggregate_binder.BindChild(aggr.filter, 0, error);
	}

	// Handle ordered-set aggregates by moving the single ORDER BY expression to the front of the children.
	//	https://www.postgresql.org/docs/current/functions-aggregate.html#FUNCTIONS-ORDEREDSET-TABLE
	// We also have to handle ORDER BY in the argument list, so note how many arguments we should have
	// and only inject the ordering expression if there are too few.
	idx_t ordered_set_agg = 0;
	bool negate_fractions = false;
	if (aggr.order_bys && aggr.order_bys->orders.size() == 1) {
		const auto &func_name = aggr.function_name;
		if (func_name == "mode") {
			ordered_set_agg = 1;
		} else if (func_name == "quantile_cont" || func_name == "quantile_disc") {
			ordered_set_agg = 2;

			auto &config = DBConfig::GetConfig(context);
			const auto &order = aggr.order_bys->orders[0];
			const auto sense =
			    (order.type == OrderType::ORDER_DEFAULT) ? config.options.default_order_type : order.type;
			negate_fractions = (sense == OrderType::DESCENDING);
		}
	}

	for (idx_t i = 0; i < aggr.children.size(); ++i) {
		auto &child = aggr.children[i];
		aggregate_binder.BindChild(child, 0, error);
		// We have to negate the fractions for PERCENTILE_XXXX DESC
		if (!error.HasError() && ordered_set_agg && i == aggr.children.size() - 1) {
			NegatePercentileFractions(context, child, negate_fractions);
		}
	}

	// Bind the ORDER BYs, if any
	if (aggr.order_bys && !aggr.order_bys->orders.empty()) {
		for (auto &order : aggr.order_bys->orders) {
			if (order.expression->GetExpressionType() == ExpressionType::VALUE_CONSTANT) {
				auto &const_expr = order.expression->Cast<ConstantExpression>();
				if (!const_expr.value.type().IsIntegral()) {
					auto &config = ClientConfig::GetConfig(context);
					if (!config.order_by_non_integer_literal) {
						throw BinderException(
						    *order.expression,
						    "ORDER BY non-integer literal has no effect.\n* SET order_by_non_integer_literal=true to "
						    "allow this behavior.\n\nPerhaps you misplaced ORDER BY; ORDER BY must appear "
						    "after all regular arguments of the aggregate.");
					}
				}
			}
			aggregate_binder.BindChild(order.expression, 0, error);
		}
	}

	if (error.HasError()) {
		// failed to bind child
		if (aggregate_binder.HasBoundColumns()) {
			for (idx_t i = 0; i < aggr.children.size(); i++) {
				// however, we bound columns!
				// that means this aggregation belongs to this node
				// check if we have to resolve any errors by binding with parent binders
				auto result = aggregate_binder.BindCorrelatedColumns(aggr.children[i], error);
				// if there is still an error after this, we could not successfully bind the aggregate
				if (result.HasError()) {
					result.error.Throw();
				}
				auto &bound_expr = BoundExpression::GetExpression(*aggr.children[i]);
				ExtractCorrelatedExpressions(binder, *bound_expr);
			}
			if (aggr.filter) {
				auto result = aggregate_binder.BindCorrelatedColumns(aggr.filter, error);
				// if there is still an error after this, we could not successfully bind the aggregate
				if (result.HasError()) {
					result.error.Throw();
				}
				auto &bound_expr = BoundExpression::GetExpression(*aggr.filter);
				ExtractCorrelatedExpressions(binder, *bound_expr);
			}
			if (aggr.order_bys && !aggr.order_bys->orders.empty()) {
				for (auto &order : aggr.order_bys->orders) {
					auto result = aggregate_binder.BindCorrelatedColumns(order.expression, error);
					if (result.HasError()) {
						result.error.Throw();
					}
					auto &bound_expr = BoundExpression::GetExpression(*order.expression);
					ExtractCorrelatedExpressions(binder, *bound_expr);
				}
			}
		} else {
			// we didn't bind columns, try again in children
			return BindResult(std::move(error));
		}
	} else if (depth > 0 && !aggregate_binder.HasBoundColumns()) {
		return BindResult("Aggregate with only constant parameters has to be bound in the root subquery");
	}

	if (aggr.filter) {
		auto &child = BoundExpression::GetExpression(*aggr.filter);
		bound_filter = BoundCastExpression::AddCastToType(context, std::move(child), LogicalType::BOOLEAN);
	}

	// all children bound successfully
	// extract the children and types
	vector<LogicalType> types;
	vector<LogicalType> arguments;
	vector<unique_ptr<Expression>> children;

	if (ordered_set_agg) {
		const bool order_sensitive = (aggr.function_name == "mode");
		// Inject missing ordering arguments
		if (aggr.children.size() < ordered_set_agg) {
			for (auto &order : aggr.order_bys->orders) {
				auto &child = BoundExpression::GetExpression(*order.expression);
				types.push_back(child->return_type);
				arguments.push_back(child->return_type);
				if (order_sensitive) {
					children.push_back(child->Copy());
				} else {
					children.push_back(std::move(child));
				}
			}
		}
		if (!order_sensitive) {
			aggr.order_bys->orders.clear();
		}
	}

	for (idx_t i = 0; i < aggr.children.size(); i++) {
		auto &child = BoundExpression::GetExpression(*aggr.children[i]);
		types.push_back(child->return_type);
		arguments.push_back(child->return_type);
		children.push_back(std::move(child));
	}

	// bind the aggregate
	FunctionBinder function_binder(binder);
	auto best_function = function_binder.BindFunction(func.name, func.functions, types, error);
	if (!best_function.IsValid()) {
		error.AddQueryLocation(aggr);
		error.Throw();
	}
	// found a matching function!
	auto bound_function = func.functions.GetFunctionByOffset(best_function.GetIndex());

	// Bind any sort columns, unless the aggregate is order-insensitive
	unique_ptr<BoundOrderModifier> order_bys;
	if (!aggr.order_bys->orders.empty()) {
		order_bys = make_uniq<BoundOrderModifier>();
		auto &config = DBConfig::GetConfig(context);
		for (auto &order : aggr.order_bys->orders) {
			auto &order_expr = BoundExpression::GetExpression(*order.expression);
			PushCollation(context, order_expr, order_expr->return_type);
			const auto sense = config.ResolveOrder(order.type);
			const auto null_order = config.ResolveNullOrder(sense, order.null_order);
			order_bys->orders.emplace_back(sense, null_order, std::move(order_expr));
		}
	}

	// If the aggregate is DISTINCT then the ORDER BYs need to be functional dependencies of the arguments.
	if (aggr.distinct && order_bys) {
		bool in_args = true;
		for (const auto &order_by : order_bys->orders) {
			in_args &= IsFunctionallyDependent(order_by.expression, children);
		}

		if (!in_args) {
			throw BinderException("In a DISTINCT aggregate, ORDER BY expressions must appear in the argument list");
		}
	}

	auto aggregate =
	    function_binder.BindAggregateFunction(bound_function, std::move(children), std::move(bound_filter),
	                                          aggr.distinct ? AggregateType::DISTINCT : AggregateType::NON_DISTINCT);
	if (aggr.export_state) {
		aggregate = ExportAggregateFunction::Bind(std::move(aggregate));
	}
	aggregate->order_bys = std::move(order_bys);

	// check for all the aggregates if this aggregate already exists
	idx_t aggr_index;
	auto entry = node.aggregate_map.find(*aggregate);
	if (entry == node.aggregate_map.end()) {
		// new aggregate: insert into aggregate list
		aggr_index = node.aggregates.size();
		node.aggregate_map[*aggregate] = aggr_index;
		node.aggregates.push_back(std::move(aggregate));
	} else {
		// duplicate aggregate: simplify refer to this aggregate
		aggr_index = entry->second;
	}

	// now create a column reference referring to the aggregate
	auto colref = make_uniq<BoundColumnRefExpression>(
	    aggr.GetAlias().empty() ? node.aggregates[aggr_index]->ToString() : aggr.GetAlias(),
	    node.aggregates[aggr_index]->return_type, ColumnBinding(node.aggregate_index, aggr_index), depth);
	// move the aggregate expression into the set of bound aggregates
	return BindResult(std::move(colref));
}